

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O0

pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *
__thiscall
CppMLNN::preprocess_data
          (pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           *__return_storage_ptr__,CppMLNN *this,MatrixXd *examples,VectorXd *labels)

{
  ostream *this_00;
  undefined1 local_58 [8];
  MatrixXd examples_norm;
  MatrixXd labels_mat;
  VectorXd *labels_local;
  MatrixXd *examples_local;
  CppMLNN *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,"preprocess_data");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  build_labels_matrix((MatrixXd *)
                      &examples_norm.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols,this,labels);
  normalize_examples((MatrixXd *)local_58,this,examples);
  std::make_pair<Eigen::Matrix<double,_1,_1,0,_1,_1>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
            (__return_storage_ptr__,(Matrix<double,__1,__1,_0,__1,__1> *)local_58,
             (Matrix<double,__1,__1,_0,__1,__1> *)
             &examples_norm.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_58);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &examples_norm.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  return __return_storage_ptr__;
}

Assistant:

pair<MatrixXd, MatrixXd> CppMLNN::preprocess_data(const MatrixXd& examples, const VectorXd& labels) {
	cout << __FUNCTION__ << endl;

	MatrixXd labels_mat = build_labels_matrix(labels);
	MatrixXd examples_norm = normalize_examples(examples);

	return make_pair(examples_norm, labels_mat);
}